

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

int32 rw::getSizeMesh(void *object,int32 param_2,int32 param_3)

{
  undefined4 local_2c;
  int32 size;
  Geometry *geo;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if (*(long *)((long)object + 0x90) == 0) {
    object_local._4_4_ = -1;
  }
  else {
    local_2c = (uint)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 8 + 0xc;
    if ((*(uint *)((long)object + 0x10) & 0x1000000) == 0) {
      local_2c = *(int *)(*(long *)((long)object + 0x90) + 8) * 4 + local_2c;
    }
    else if (**(int **)((long)object + 0x98) == 0xb) {
      local_2c = *(int *)(*(long *)((long)object + 0x90) + 8) * 2 + local_2c;
    }
    object_local._4_4_ = local_2c;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeMesh(void *object, int32, int32)
{
	Geometry *geo = (Geometry*)object;
	if(geo->meshHeader == nil)
		return -1;
	int32 size = 12 + geo->meshHeader->numMeshes*8;
	if(geo->flags & Geometry::NATIVE){
		assert(geo->instData != nil);
		if(geo->instData->platform == PLATFORM_WDGL)
			size += geo->meshHeader->totalIndices*2;
	}else{
		size += geo->meshHeader->totalIndices*4;
	}
	return size;
}